

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O2

int Cba_NtkCheckComboLoop(Cba_Ntk_t *p)

{
  int iVar1;
  int i;
  
  Cba_NtkCleanObjCopies(p);
  i = 1;
  while( true ) {
    if ((p->vObjType).nSize <= i) {
      return 1;
    }
    iVar1 = Cba_ObjIsBox(p,i);
    if (((iVar1 != 0) && (iVar1 = Cba_ObjIsSeq(p,i), iVar1 == 0)) &&
       (iVar1 = Cba_NtkCheckComboLoop_rec(p,i), iVar1 == 0)) break;
    i = i + 1;
  }
  puts("Cyclic dependency of user boxes is detected.");
  return 0;
}

Assistant:

int Cba_NtkCheckComboLoop( Cba_Ntk_t * p )
{
    int iObj;
    Cba_NtkCleanObjCopies( p ); // -1 = not visited; 0 = on the path; 1 = finished
    Cba_NtkForEachBox( p, iObj )
        if ( !Cba_ObjIsSeq(p, iObj) )
            if ( !Cba_NtkCheckComboLoop_rec( p, iObj ) )
            {
                printf( "Cyclic dependency of user boxes is detected.\n" );
                return 0;
            }
    return 1;
}